

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  uint8_t c;
  calc_out_t result;
  uint32_t j;
  uint64_t carry;
  uint32_t i;
  uint32_t in_stack_00000cc4;
  uint64_t *in_stack_00000cc8;
  uint32_t in_stack_00000cd4;
  uint64_t *in_stack_00000cd8;
  uint64_t *in_stack_00000ce0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar4;
  uint64_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar5;
  
  if ((in_EDX < 8) || (in_R8D < 8)) {
    uVar2 = mulOne(in_RCX,(uint64_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),
                   (uint32_t)(in_stack_ffffffffffffffb0 >> 0x20),
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(uint64_t *)(in_RDI + (ulong)in_EDX * 8) = uVar2;
    for (uVar5 = 1; uVar5 < in_R8D; uVar5 = uVar5 + 1) {
      uVar2 = 0;
      for (uVar4 = 0; uVar4 < in_EDX; uVar4 = uVar4 + 1) {
        uVar3 = mulTerm(*(uint64_t *)(in_RSI + (ulong)uVar4 * 8),in_RCX[uVar5],
                        (uint64_t *)&stack0xffffffffffffffb0);
        uVar1 = *(ulong *)(in_RDI + (ulong)(uVar5 + uVar4) * 8);
        *(uint64_t *)(in_RDI + (ulong)(uVar5 + uVar4) * 8) = uVar3 + uVar1;
        uVar2 = CARRY8(uVar3,uVar1) + uVar2;
      }
      *(uint64_t *)(in_RDI + (ulong)(uVar5 + in_EDX) * 8) = uVar2;
    }
  }
  else {
    mulKaratsuba(in_stack_00000ce0,in_stack_00000cd8,in_stack_00000cd4,in_stack_00000cc8,
                 in_stack_00000cc4);
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}